

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Engine.cpp
# Opt level: O3

string * __thiscall
adios2::core::engine::BP5Engine::GetBPVersionFileName
          (string *__return_storage_ptr__,BP5Engine *this,string *name)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  string bpName;
  undefined1 *local_58;
  ulong local_50;
  undefined1 local_48 [16];
  string local_38;
  
  helper::RemoveTrailingSlash(&local_38,name);
  local_58 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,local_38._M_dataplus._M_p,
             local_38._M_dataplus._M_p + local_38._M_string_length);
  std::__cxx11::string::_M_replace_aux((ulong)&local_58,local_50,0,'\x01');
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_58);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BP5Engine::GetBPVersionFileName(const std::string &name) const noexcept
{
    const std::string bpName = helper::RemoveTrailingSlash(name);
    /* the name of the version file is ".bpversion" */
    const std::string bpVersionFileName(bpName + PathSeparator + ".bpversion");
    return bpVersionFileName;
}